

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserBoxShadow.cpp
# Opt level: O2

bool __thiscall
Rml::PropertyParserBoxShadow::ParseValue
          (PropertyParserBoxShadow *this,Property *property,String *value,ParameterMap *param_3)

{
  pointer pBVar1;
  pointer pbVar2;
  pointer pbVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  Colour<unsigned_char,_255,_true> CVar7;
  NumericValue NVar8;
  pointer string;
  pointer __lhs;
  int iVar9;
  Colour<unsigned_char,_255,_false> local_14c;
  StringList arguments;
  StringList shadows_string_list;
  BoxShadowList shadow_list;
  String lowercase_value;
  char cStack_b0;
  char cStack_af;
  char cStack_ae;
  char cStack_ad;
  String local_80;
  ParameterMap empty_parameter_map;
  
  if ((value->_M_string_length == 0) || (bVar4 = ::std::operator==(value,"none"), bVar4)) {
    Variant::Variant((Variant *)&lowercase_value);
    Variant::operator=(&property->value,(Variant *)&lowercase_value);
    Variant::~Variant((Variant *)&lowercase_value);
    property->unit = UNKNOWN;
    bVar4 = true;
  }
  else {
    shadows_string_list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    shadows_string_list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    shadows_string_list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::__cxx11::string::string((string *)&local_80,(string *)value);
    StringUtilities::ToLower(&lowercase_value,&local_80);
    ::std::__cxx11::string::~string((string *)&local_80);
    StringUtilities::ExpandString(&shadows_string_list,&lowercase_value,',','(',')',false);
    ::std::__cxx11::string::~string((string *)&lowercase_value);
    if (shadows_string_list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        shadows_string_list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar4 = false;
    }
    else {
      empty_parameter_map.mKeyVals = (Node *)&empty_parameter_map.mMask;
      empty_parameter_map.mNumElements = 0;
      empty_parameter_map.mMask = 0;
      empty_parameter_map.mMaxNumElementsAllowed = 0;
      shadow_list.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      empty_parameter_map.mInfoInc = 0x20;
      empty_parameter_map.mInfoHashShift = 0;
      shadow_list.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      shadow_list.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      empty_parameter_map.mInfo = (uint8_t *)empty_parameter_map.mKeyVals;
      ::std::vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>::reserve
                (&shadow_list,
                 (long)shadows_string_list.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)shadows_string_list.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
      pbVar3 = shadows_string_list.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      string = shadows_string_list.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        bVar4 = string == pbVar3;
        if (bVar4) {
          property->unit = BOXSHADOWLIST;
          Variant::Variant<std::vector<Rml::BoxShadow,std::allocator<Rml::BoxShadow>>,void>
                    ((Variant *)&lowercase_value,&shadow_list);
          Variant::operator=(&property->value,(Variant *)&lowercase_value);
          Variant::~Variant((Variant *)&lowercase_value);
          break;
        }
        arguments.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        arguments.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        arguments.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        StringUtilities::ExpandString(&arguments,string,' ','(',')',false);
        if (arguments.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            arguments.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
LAB_002b399f:
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&arguments);
          break;
        }
        lowercase_value._M_dataplus._M_p._0_4_ = 0xff000000;
        lowercase_value.field_2._4_8_ = 0;
        lowercase_value.field_2._12_1_ = '\0';
        lowercase_value.field_2._13_1_ = '\0';
        lowercase_value.field_2._14_1_ = '\0';
        lowercase_value.field_2._15_1_ = '\0';
        cStack_b0 = '\0';
        cStack_af = '\0';
        cStack_ae = '\0';
        cStack_ad = '\0';
        lowercase_value._4_8_ = 0;
        lowercase_value._12_8_ = 0;
        ::std::vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>::emplace_back<Rml::BoxShadow>
                  (&shadow_list,(BoxShadow *)&lowercase_value);
        pBVar1 = shadow_list.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pbVar2 = arguments.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        iVar9 = 0;
        for (__lhs = arguments.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; __lhs != pbVar2; __lhs = __lhs + 1)
        {
          if (__lhs->_M_string_length != 0) {
            Property::Property((Property *)&lowercase_value);
            iVar6 = (*this->parser_length->_vptr_PropertyParser[2])
                              (this->parser_length,(Property *)&lowercase_value,__lhs,
                               &empty_parameter_map);
            if ((char)iVar6 == '\0') {
              bVar5 = ::std::operator==(__lhs,"inset");
              if (bVar5) {
                pBVar1[-1].inset = true;
              }
              else {
                iVar6 = (*this->parser_color->_vptr_PropertyParser[2])
                                  (this->parser_color,(Property *)&lowercase_value,__lhs,
                                   &empty_parameter_map);
                if ((char)iVar6 == '\0') goto switchD_002b38d1_default;
                local_14c = Property::Get<Rml::Colour<unsigned_char,255,false>>
                                      ((Property *)&lowercase_value);
                CVar7 = Colour<unsigned_char,255,false>::
                        ToPremultiplied<std::integral_constant<bool,false>,void>(&local_14c);
                pBVar1[-1].color.red = CVar7.red;
                pBVar1[-1].color.green = CVar7.green;
                pBVar1[-1].color.blue = CVar7.blue;
                pBVar1[-1].color.alpha = CVar7.alpha;
              }
            }
            else {
              switch(iVar9) {
              case 0:
                NVar8 = Property::GetNumericValue((Property *)&lowercase_value);
                pBVar1[-1].offset_x = NVar8;
                break;
              case 1:
                NVar8 = Property::GetNumericValue((Property *)&lowercase_value);
                pBVar1[-1].offset_y = NVar8;
                break;
              case 2:
                NVar8 = Property::GetNumericValue((Property *)&lowercase_value);
                pBVar1[-1].blur_radius = NVar8;
                break;
              case 3:
                NVar8 = Property::GetNumericValue((Property *)&lowercase_value);
                pBVar1[-1].spread_distance = NVar8;
                break;
              default:
switchD_002b38d1_default:
                Property::~Property((Property *)&lowercase_value);
                goto LAB_002b399f;
              }
              iVar9 = iVar9 + 1;
            }
            Property::~Property((Property *)&lowercase_value);
          }
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&arguments);
        string = string + 1;
      } while (1 < iVar9);
      ::std::_Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>::~_Vector_base
                (&shadow_list.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>);
      robin_hood::detail::
      Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::destroy(&empty_parameter_map);
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&shadows_string_list);
  }
  return bVar4;
}

Assistant:

bool PropertyParserBoxShadow::ParseValue(Property& property, const String& value, const ParameterMap& /*parameters*/) const
{
	if (value.empty() || value == "none")
	{
		property.value = Variant();
		property.unit = Unit::UNKNOWN;
		return true;
	}

	StringList shadows_string_list;
	{
		auto lowercase_value = StringUtilities::ToLower(value);
		StringUtilities::ExpandString(shadows_string_list, lowercase_value, ',', '(', ')');
	}

	if (shadows_string_list.empty())
		return false;

	const ParameterMap empty_parameter_map;

	BoxShadowList shadow_list;
	shadow_list.reserve(shadows_string_list.size());

	for (const String& shadow_str : shadows_string_list)
	{
		StringList arguments;
		StringUtilities::ExpandString(arguments, shadow_str, ' ', '(', ')');
		if (arguments.empty())
			return false;

		shadow_list.push_back({});
		BoxShadow& shadow = shadow_list.back();

		int length_argument_index = 0;

		for (const String& argument : arguments)
		{
			if (argument.empty())
				continue;

			Property prop;
			if (parser_length->ParseValue(prop, argument, empty_parameter_map))
			{
				switch (length_argument_index)
				{
				case 0: shadow.offset_x = prop.GetNumericValue(); break;
				case 1: shadow.offset_y = prop.GetNumericValue(); break;
				case 2: shadow.blur_radius = prop.GetNumericValue(); break;
				case 3: shadow.spread_distance = prop.GetNumericValue(); break;
				default: return false;
				}
				length_argument_index += 1;
			}
			else if (argument == "inset")
			{
				shadow.inset = true;
			}
			else if (parser_color->ParseValue(prop, argument, empty_parameter_map))
			{
				shadow.color = prop.Get<Colourb>().ToPremultiplied();
			}
			else
			{
				return false;
			}
		}

		if (length_argument_index < 2)
			return false;
	}

	property.unit = Unit::BOXSHADOWLIST;
	property.value = Variant(std::move(shadow_list));

	return true;
}